

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O1

void make_edges(chunk_conflict *c,_Bool ragged,_Bool valley)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint uVar3;
  loc lVar4;
  wchar_t *pwVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  loc lVar11;
  ulong uVar12;
  loc lVar13;
  wchar_t path_x [3];
  uint local_4c;
  uint auStack_3c [3];
  
  uVar2 = Rand_div(2);
  uVar9 = uVar2 + 2;
  if (-2 < (int)uVar2) {
    uVar6 = 1;
    if (1 < (int)uVar9) {
      uVar6 = (ulong)uVar9;
    }
    uVar12 = 0;
    do {
      uVar2 = Rand_div((c->width + -0x14) / (int)uVar9 - 2);
      auStack_3c[uVar12] = ((int)uVar12 * (c->width + -0x14)) / (int)uVar9 + uVar2 + 10;
      uVar12 = uVar12 + 1;
    } while (uVar6 != uVar12);
  }
  local_4c = valley + 4;
  if (0 < c->width) {
    uVar3 = (uint)valley * 3 + 7;
    lVar13.x = L'\0';
    lVar13.y = L'\0';
    uVar7 = local_4c;
    do {
      if (ragged) {
        uVar2 = Rand_div(3);
        uVar7 = (uVar7 - uVar2) + 1;
        if ((int)uVar3 <= (int)uVar7) {
          uVar7 = uVar3;
        }
        if ((int)uVar7 < 2) {
          uVar7 = 1;
        }
        lVar10 = 0;
        do {
          _Var1 = square_ismark(c,(loc)((long)lVar13 + lVar10));
          if (!_Var1) {
            square_set_feat(c,(loc)((long)lVar13 + lVar10),FEAT_PERM);
          }
          lVar10 = lVar10 + 0x100000000;
        } while ((ulong)uVar7 << 0x20 != lVar10);
        if ((lVar13 != (loc)0x0 && valley) &&
           (lVar4.y = L'\0', lVar4.x = player->upkeep->path_coord, lVar13 == lVar4)) {
          square_set_feat(c,(loc)(lVar10 + (long)lVar13),FEAT_PASS_RUBBLE);
          player_place((chunk_conflict2 *)c,player,(loc_conflict)(lVar10 + (long)lVar13));
        }
      }
      else {
        square_set_feat(c,lVar13,FEAT_PERM);
      }
      lVar13 = (loc)((long)lVar13 + 1);
    } while ((long)lVar13 < (long)c->width);
  }
  if (0 < c->width) {
    uVar6 = 0;
    iVar8 = 0;
    do {
      if ((!ragged) || ((uVar7 = 7, valley && (uVar7 = 10, player->depth == 0x46)))) {
        square_set_feat(c,(loc)((ulong)(c->height - 1) << 0x20 | uVar6),FEAT_PERM);
      }
      else {
        uVar2 = Rand_div(3);
        local_4c = (local_4c - uVar2) + 1;
        if ((int)uVar7 <= (int)local_4c) {
          local_4c = uVar7;
        }
        if ((int)local_4c < 2) {
          local_4c = 1;
        }
        uVar3 = c->height;
        uVar7 = uVar3 - 1;
        if ((int)(~local_4c + uVar3) < (int)uVar7) {
          do {
            uVar7 = uVar3;
            lVar13 = (loc)((ulong)(uVar7 - 1) << 0x20 | uVar6);
            _Var1 = square_ismark(c,lVar13);
            if (!_Var1) {
              if ((!valley) || (pwVar5 = &FEAT_VOID, uVar7 == c->height)) {
                pwVar5 = &FEAT_PERM;
              }
              square_set_feat(c,lVar13,*pwVar5);
            }
            uVar3 = uVar7 - 1;
          } while ((int)(c->height + ~local_4c) < (int)(uVar7 - 2));
          uVar7 = uVar7 - 2;
        }
        if ((iVar8 < (int)uVar9 && valley) && (uVar6 == auStack_3c[iVar8])) {
          lVar13 = (loc)((ulong)uVar7 << 0x20 | uVar6);
          square_set_feat(c,lVar13,FEAT_MORE_SOUTH);
          square_mark(c,lVar13);
          iVar8 = iVar8 + 1;
        }
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)c->width);
  }
  if (0 < c->height) {
    uVar6 = 5;
    lVar11.x = L'\0';
    lVar11.y = L'\0';
    lVar10 = 0;
    do {
      if (ragged) {
        uVar2 = Rand_div(3);
        uVar9 = ((int)uVar6 - uVar2) + 1;
        if (9 < (int)uVar9) {
          uVar9 = 10;
        }
        if ((int)uVar9 < 2) {
          uVar9 = 1;
        }
        uVar6 = (ulong)uVar9;
        uVar12 = uVar6;
        lVar13 = lVar11;
        do {
          _Var1 = square_ismark(c,lVar13);
          if (!_Var1) {
            square_set_feat(c,lVar13,FEAT_PERM);
          }
          lVar13 = (loc)((long)lVar13 + 1);
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      else {
        square_set_feat(c,(loc)(lVar10 << 0x20),FEAT_PERM);
      }
      lVar10 = lVar10 + 1;
      lVar11 = (loc)((long)lVar11 + 0x100000000);
    } while (lVar10 < c->height);
  }
  if (0 < c->height) {
    uVar9 = 5;
    lVar10 = 0;
    do {
      if (ragged) {
        uVar2 = Rand_div(3);
        uVar9 = (uVar9 - uVar2) + 1;
        if (9 < (int)uVar9) {
          uVar9 = 10;
        }
        if ((int)uVar9 < 2) {
          uVar9 = 1;
        }
        uVar7 = c->width - 1;
        if ((int)(c->width + ~uVar9) < (int)uVar7) {
          do {
            lVar13 = (loc)((ulong)uVar7 | lVar10 << 0x20);
            _Var1 = square_ismark(c,lVar13);
            if (!_Var1) {
              square_set_feat(c,lVar13,FEAT_PERM);
            }
            uVar7 = uVar7 - 1;
          } while ((int)(c->width + ~uVar9) < (int)uVar7);
        }
      }
      else {
        square_set_feat(c,(loc)((ulong)(c->width - 1) | lVar10 << 0x20),FEAT_PERM);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < c->height);
  }
  return;
}

Assistant:

static void make_edges(struct chunk *c, bool ragged, bool valley)
{
	int i, j, num = 2;
	int path_x[3];
	struct loc grid;

	/* Prepare places for down slides */
	num += randint0(2);
	for (i = 0; i < num; i++)
		/*
		 * Skip first and last ten columns to avoid surrounding the
		 * slide in permanent walls.  Avoid last two columns in each
		 * interval to limit the possibility of nearby slides.
		 */
		path_x[i] = 10 + randint0((c->width - 20) / num - 2)
			+ (i * (c->width - 20)) / num;

	/* Special boundary walls -- Top */
	i = (valley ? 5 : 4);
	for (grid.x = 0; grid.x < c->width; grid.x++) {
		if (ragged) {
			i += 1 - randint0(3);
			if (i > (valley ? 10 : 7))
				i = (valley ? 10 : 7);
			if (i < 1)
				i = 1;
			for (grid.y = 0; grid.y < i; grid.y++) {
				/* Clear previous contents, add perma-wall */
				if (!square_ismark(c, grid)) {
					square_set_feat(c, grid, FEAT_PERM);
				}
			}
			if (valley && (grid.x > 0) &&
				(grid.x == player->upkeep->path_coord)) {
				if (grid.y == 0) {
					grid.y++;
				}
				square_set_feat(c, grid, FEAT_PASS_RUBBLE);
				player_place(c, player, grid);
			}
		} else {
			grid.y = 0;

			/* Clear previous contents, add perma-wall */
			square_set_feat(c, grid, FEAT_PERM);
		}
	}


	/* Special boundary walls -- Bottom */
	i = (valley ? 5 : 4);
	j = 0;
	for (grid.x = 0; grid.x < c->width; grid.x++) {
		if (ragged && !(valley && (player->depth == 70))) {
			i += 1 - randint0(3);
			if (i > (valley ? 10 : 7))
				i = (valley ? 10 : 7);
			if (i < 1)
				i = 1;
			for (grid.y = c->height - 1; grid.y > c->height - 1 - i; grid.y--) {
				/* Clear previous contents, add perma-wall or void */
				if (!square_ismark(c, grid)) {
					square_set_feat(c, grid, (valley && grid.y != c->height - 1) ? FEAT_VOID : FEAT_PERM);
				}
			}
			/* Down slides */
			if ((j < num) && valley)
				if (grid.x == path_x[j]) {
					square_set_feat(c, grid, FEAT_MORE_SOUTH);
					/* Mark so it won't be overwritten. */
					square_mark(c, grid);
					j++;
				}
		} else {
			grid.y = c->height - 1;

			/* Clear previous contents, add perma-wall */
			square_set_feat(c, grid, FEAT_PERM);
		}
	}

	/* Special boundary walls -- Left */
	i = 5;
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		if (ragged) {
			i += 1 - randint0(3);
			if (i > 10)
				i = 10;
			if (i < 1)
				i = 1;
			for (grid.x = 0; grid.x < i; grid.x++) {
				/* Clear previous contents, add perma-wall */
				if (!square_ismark(c, grid)) {
					square_set_feat(c, grid, FEAT_PERM);
				}
			}
		} else {
			grid.x = 0;

			/* Clear previous contents, add perma-wall */
			square_set_feat(c, grid, FEAT_PERM);
		}
	}

	/* Special boundary walls -- Right */
	i = 5;
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		if (ragged) {
			i += 1 - randint0(3);
			if (i > 10)
				i = 10;
			if (i < 1)
				i = 1;
			for (grid.x = c->width - 1; grid.x > c->width - 1 - i; grid.x--) {
				/* Clear previous contents, add perma-wall */
				if (!square_ismark(c, grid)) {
					square_set_feat(c, grid, FEAT_PERM);
				}
			}
		} else {
			grid.x = c->width - 1;

			/* Clear previous contents, add perma-wall */
			square_set_feat(c, grid, FEAT_PERM);
		}
	}
}